

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

char * archive_entry_copy_fflags_text(archive_entry *entry,char *flags)

{
  char *pcVar1;
  char *flags_local;
  archive_entry *entry_local;
  
  archive_mstring_copy_mbs(&entry->ae_fflags_text,flags);
  pcVar1 = ae_strtofflags(flags,&entry->ae_fflags_set,&entry->ae_fflags_clear);
  return pcVar1;
}

Assistant:

const char *
archive_entry_copy_fflags_text(struct archive_entry *entry,
    const char *flags)
{
	archive_mstring_copy_mbs(&entry->ae_fflags_text, flags);
	return (ae_strtofflags(flags,
		    &entry->ae_fflags_set, &entry->ae_fflags_clear));
}